

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.hpp
# Opt level: O3

bool check_more_than_two_unique_values
               (size_t *ix_arr,size_t st,size_t end,int *x,MissingAction missing_action)

{
  size_t *psVar1;
  bool bVar2;
  ulong uVar3;
  
  if (1 < end - st) {
    if (missing_action == Fail) {
      uVar3 = st + 1;
      do {
        bVar2 = uVar3 <= end;
        if (end < uVar3) {
          return bVar2;
        }
        psVar1 = ix_arr + uVar3;
        uVar3 = uVar3 + 1;
      } while (x[*psVar1] == x[ix_arr[st]]);
      return bVar2;
    }
    if (st <= end) {
      do {
        missing_action = x[ix_arr[st]];
        st = st + 1;
        if (-1 < (int)missing_action) break;
      } while (st <= end);
    }
    if (st <= end) {
      do {
        uVar3 = st + 1;
        bVar2 = x[ix_arr[st]] != missing_action && -1 < x[ix_arr[st]];
        if (bVar2) {
          return bVar2;
        }
        st = uVar3;
      } while (uVar3 <= end);
      return bVar2;
    }
  }
  return false;
}

Assistant:

bool check_more_than_two_unique_values(size_t ix_arr[], size_t st, size_t end, int x[], MissingAction missing_action)
{
    if (end - st <= 1) return false;

    if (missing_action == Fail)
    {
        int x0 = x[ix_arr[st]];
        for (size_t ix = st+1; ix <= end; ix++)
        {
            if (x[ix_arr[ix]] != x0) return true;
        }
    }

    else
    {
        int x0;
        size_t ix;
        for (ix = st; ix <= end; ix++)
        {
            if (x[ix_arr[ix]] >= 0)
            {
                x0 = x[ix_arr[ix]];
                ix++;
                break;
            }
        }

        for (; ix <= end; ix++)
        {
            if (x[ix_arr[ix]] >= 0 && x[ix_arr[ix]] != x0)
                return true;
        }
    }

    return false;
}